

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O0

void push_marker_options_t::print_options(void)

{
  printf("Usage: push_markers [options] \n");
  printf(
        " [-u url]                       Publishing Point URL without /Streams() extension\n [--avail]                      signal an advertisment slot every arg1 ms with duration of arg2 ms (default is 60000 and 10000) \n [--seg_dur]                    segment duration of avail segments in the timed metadata track in ms (default = 2000ms) \n [--track_id]                   Track id to put in the track (default is 1), event track will use track id, vtt track track_id + 1 [--dry_run]                    Do a dry run and write the output files to disk directly for checking file and box integrity default is false\n [--announce]                   specify the number of milliseconds seconds in advance to presenation time to send an avail (default is 0) [--vtt]                        send vtt time codes in mp4 segments (default = false) [--no_event]                   dont send event track MPEG-B part 18 (default = true) [--initialization]             SegmentTemplate@initialization sets the relative path for init segments, shall include $RepresentationID$ \n [--media]                      SegmentTemplate@media sets the relative path for media segments, shall include $RepresentationID$ and $Time$ or $Number$ \n [--splice_immediate]           Toggle the splice_immediate flag in SCTE-35 markers\n"
        );
  return;
}

Assistant:

static void print_options()
    {
        printf("Usage: push_markers [options] \n");
        printf(
            " [-u url]                       Publishing Point URL without /Streams() extension\n"
            " [--avail]                      signal an advertisment slot every arg1 ms with duration of arg2 ms (default is 60000 and 10000) \n"
            " [--seg_dur]                    segment duration of avail segments in the timed metadata track in ms (default = 2000ms) \n"                 
            " [--track_id]                   Track id to put in the track (default is 1), event track will use track id, vtt track track_id + 1"
            " [--dry_run]                    Do a dry run and write the output files to disk directly for checking file and box integrity default is false\n"
            " [--announce]                   specify the number of milliseconds seconds in advance to presenation time to send an avail (default is 0)"
            " [--vtt]                        send vtt time codes in mp4 segments (default = false)"
            " [--no_event]                   dont send event track MPEG-B part 18 (default = true)"
            " [--initialization]             SegmentTemplate@initialization sets the relative path for init segments, shall include $RepresentationID$ \n"
            " [--media]                      SegmentTemplate@media sets the relative path for media segments, shall include $RepresentationID$ and $Time$ or $Number$ \n"
            " [--splice_immediate]           Toggle the splice_immediate flag in SCTE-35 markers"
            "\n");
    }